

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O2

int interval_comp(int a,int b,int c,int d)

{
  if (c <= a) {
    if (c < a) {
      return 1;
    }
    if (d <= b) {
      return (int)(d < b);
    }
  }
  return -1;
}

Assistant:

int interval_comp(int a, int b, int c, int d) {
    if (a < c) return -1;
    else if (a > c) return 1;
    else {
        if (b < d) return -1;
        else if (b > d) return 1;
        else return 0;
    }
}